

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O3

ChVectorDynamic<> __thiscall
chrono::fea::ChLinkPointFrame::GetConstraintViolation(ChLinkPointFrame *this)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  void *pvVar13;
  undefined8 *puVar14;
  ulong uVar15;
  long in_RSI;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  ChVectorDynamic<> CVar32;
  ChQuaternion<double> q;
  ChMatrix33<double> Arw;
  ChQuaternion<double> local_98;
  ChMatrix33<double> local_78;
  
  lVar6 = *(long *)(in_RSI + 0x268);
  auVar31._24_8_ = *(undefined8 *)(in_RSI + 0x298);
  auVar31._16_8_ = *(undefined8 *)(in_RSI + 0x298);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(lVar6 + 0x28);
  auVar5 = *(undefined1 (*) [16])(lVar6 + 0x30);
  auVar7 = vpermpd_avx2(*(undefined1 (*) [32])(in_RSI + 0x290),1);
  auVar8 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])(in_RSI + 0x2a0)),0x15);
  auVar25._0_8_ = *(ulong *)(lVar6 + 0x28) ^ 0x8000000000000000;
  auVar25._8_8_ = 0x8000000000000000;
  auVar21._0_8_ = -auVar5._0_8_;
  auVar21._8_8_ = -auVar5._8_8_;
  auVar17 = vunpcklpd_avx(auVar25,auVar17);
  auVar20._16_16_ = auVar5;
  auVar20._0_16_ = auVar17;
  auVar16._0_8_ = auVar7._0_8_ * auVar17._0_8_;
  auVar16._8_8_ = auVar7._8_8_ * auVar17._8_8_;
  auVar16._16_8_ = auVar7._16_8_ * auVar5._0_8_;
  auVar16._24_8_ = auVar7._24_8_ * auVar5._8_8_;
  uVar1 = *(undefined8 *)(lVar6 + 0x20);
  auVar7._8_8_ = uVar1;
  auVar7._0_8_ = uVar1;
  auVar7._16_8_ = uVar1;
  auVar7._24_8_ = uVar1;
  auVar16 = vfmadd231pd_avx512vl(auVar16,*(undefined1 (*) [32])(in_RSI + 0x290),auVar7);
  auVar29._24_8_ = *(undefined8 *)(lVar6 + 0x38);
  auVar29._16_8_ = *(undefined8 *)(lVar6 + 0x38);
  auVar31._8_8_ = *(undefined8 *)(in_RSI + 0x2a0);
  auVar31._0_8_ = *(undefined8 *)(in_RSI + 0x2a0);
  auVar7 = vpermpd_avx2(auVar20,0x66);
  auVar29._0_16_ = auVar21;
  auVar24._16_16_ = auVar25;
  auVar24._0_16_ = auVar21;
  auVar7 = vshufpd_avx(auVar24,auVar7,9);
  auVar20 = vpermpd_avx2(auVar29,0x24);
  auVar5 = vfmadd213pd_fma(auVar31,auVar20,auVar16);
  auVar5 = vfmadd213pd_fma(auVar7,auVar8,ZEXT1632(auVar5));
  local_98.m_data = (double  [4])ZEXT1632(auVar5);
  ChMatrix33<double>::ChMatrix33(&local_78,&local_98);
  lVar6 = *(long *)(in_RSI + 600);
  ChTransform<double>::TransformLocalToParent
            ((ChVector<double> *)(in_RSI + 0x278),
             (ChVector<double> *)(*(long *)(in_RSI + 0x268) + 8),
             (ChMatrix33<double> *)(*(long *)(in_RSI + 0x268) + 0x40));
  dVar2 = *(double *)(lVar6 + 0x20);
  dVar3 = *(double *)(lVar6 + 0x28);
  dVar10 = local_98.m_data[0];
  dVar11 = local_98.m_data[1];
  dVar4 = *(double *)(lVar6 + 0x30);
  dVar12 = local_98.m_data[2];
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)SUB168(ZEXT816(0) << 0x20,0);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus =
       (_Alloc_hider)SUB168(ZEXT816(0) << 0x20,8);
  pvVar13 = malloc(0x58);
  if (pvVar13 == (void *)0x0) {
    puVar14 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar14 = std::ostream::_M_insert<bool>;
    __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  uVar15 = (ulong)pvVar13 & 0xffffffffffffffc0;
  dVar3 = dVar3 - dVar11;
  dVar2 = dVar2 - dVar10;
  dVar4 = dVar4 - dVar12;
  *(void **)(uVar15 + 0x38) = pvVar13;
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)(uVar15 + 0x40);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p = (pointer)0x3;
  auVar26._0_8_ =
       dVar3 * local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
  auVar26._8_8_ =
       dVar3 * local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar2;
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       dVar3 * local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  auVar17 = vfmadd213sd_fma(auVar28,auVar22,auVar27);
  auVar23._8_8_ = dVar2;
  auVar23._0_8_ = dVar2;
  auVar5._8_8_ = local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar5._0_8_ = local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar5 = vfmadd132pd_fma(auVar23,auVar26,auVar5);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar4;
  auVar17 = vfmadd213sd_fma(auVar30,auVar18,auVar17);
  auVar19._8_8_ = dVar4;
  auVar19._0_8_ = dVar4;
  auVar9._8_8_ = local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar9._0_8_ = local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar5 = vfmadd132pd_fma(auVar19,auVar5,auVar9);
  *(undefined1 (*) [16])(uVar15 + 0x40) = auVar5;
  *(long *)(uVar15 + 0x50) = auVar17._0_8_;
  CVar32.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)(uVar15 + 0x40);
  CVar32.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (ChVectorDynamic<>)
         CVar32.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

ChVectorDynamic<> ChLinkPointFrame::GetConstraintViolation() const {
    ChMatrix33<> Arw(m_csys.rot >> m_body->GetRot());
    ChVector<> res = Arw.transpose() * (m_node->GetPos() - m_body->TransformPointLocalToParent(m_csys.pos));
    ChVectorN<double, 3> C;
    C(0) = res.x();
    C(1) = res.y();
    C(2) = res.z();
    return C;
}